

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O1

void wabt::WriteFixedU32Leb128(Stream *stream,uint32_t value,char *desc)

{
  undefined3 in_EAX;
  uint8_t data [5];
  undefined8 uStack_8;
  
  uStack_8 = CONCAT17((byte)(value >> 0x1c),
                      CONCAT16((char)(value >> 0x15),
                               CONCAT15((char)(value >> 0xe),
                                        CONCAT14((char)(value >> 7),CONCAT13((char)value,in_EAX)))))
             | 0x80808080000000;
  Stream::WriteData(stream,(void *)((long)&uStack_8 + 3),5,desc,No);
  return;
}

Assistant:

void WriteFixedU32Leb128(Stream* stream, uint32_t value, const char* desc) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length =
      WriteFixedU32Leb128Raw(data, data + MAX_U32_LEB128_BYTES, value);
  stream->WriteData(data, length, desc);
}